

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

void __thiscall opts::BasicOption::output(BasicOption *this,ostream *out,int max_long)

{
  size_type sVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
  if (this->s == '\0') {
    pcVar6 = "    ";
    lVar4 = 4;
    poVar3 = out;
  }
  else {
    uStack_28._0_5_ = CONCAT14(0x2d,(undefined4)uStack_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)((long)&uStack_28 + 4),1);
    uStack_28._0_6_ = CONCAT15(this->s,(undefined5)uStack_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)((long)&uStack_28 + 5),1);
    pcVar6 = ", ";
    lVar4 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out,"--",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->l)._M_dataplus._M_p,(this->l)._M_string_length);
  uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 6),1);
  sVar1 = (this->t)._M_string_length;
  if (sVar1 == 0) {
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,(this->t)._M_dataplus._M_p,sVar1);
    iVar2 = (int)(this->t)._M_string_length;
  }
  iVar2 = iVar2 + (int)(this->l)._M_string_length + 1;
  iVar5 = max_long - iVar2;
  if (iVar5 != 0 && iVar2 <= max_long) {
    do {
      uStack_28._0_4_ = CONCAT13(0x20,(undefined3)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 3),1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(this->help)._M_dataplus._M_p,(this->help)._M_string_length);
  if ((this->d)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out," [default: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(this->d)._M_dataplus._M_p,(this->d)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  }
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void            output(std::ostream& out, int max_long) const
    {
        out << "   ";
        if (s)
            out << '-' << s << ", ";
        else
            out << "    ";

        out << "--" << l << ' ';

        if (!t.empty())
            out << t;

        for (int i = long_size(); i < max_long; ++i)
            out <<  ' ';

        out << "   " << help;

        if (!d.empty())
        {
            out << " [default: " << d << "]";
        }
        out << '\n';
    }